

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

int lua_yield(lua_State *L,int nresults)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong *puVar4;
  int in_ESI;
  long in_RDI;
  TValue *top;
  TValue *t;
  cTValue *f;
  global_State *g;
  void *cf;
  undefined8 in_stack_ffffffffffffff98;
  lua_State *in_stack_ffffffffffffffa0;
  undefined8 *puVar5;
  undefined8 *local_58;
  int local_3c;
  
  uVar2 = (ulong)*(uint *)(in_RDI + 8);
  if ((*(ulong *)(in_RDI + 0x30) & 1) == 0) {
    lj_err_msg(in_stack_ffffffffffffffa0,(ErrMsg)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  }
  uVar3 = *(ulong *)(in_RDI + 0x30) & 0xfffffffffffffffc;
  if ((*(byte *)(uVar2 + 0x109) & 0x10) == 0) {
    local_58 = (undefined8 *)(*(long *)(in_RDI + 0x18) + (long)in_ESI * -8);
    if (*(undefined8 **)(in_RDI + 0x10) < local_58) {
      puVar5 = *(undefined8 **)(in_RDI + 0x10);
      local_3c = in_ESI;
      while (local_3c = local_3c + -1, -1 < local_3c) {
        *puVar5 = *local_58;
        puVar5 = puVar5 + 1;
        local_58 = local_58 + 1;
      }
      *(undefined8 **)(in_RDI + 0x18) = puVar5;
    }
    *(undefined8 *)(in_RDI + 0x30) = 0;
    *(undefined1 *)(in_RDI + 7) = 1;
    return -1;
  }
  puVar1 = *(ulong **)(in_RDI + 0x18);
  *(byte *)(uVar2 + 0x109) = *(byte *)(uVar2 + 0x109) & 0xef;
  *puVar1 = (ulong)*(uint *)(uVar3 + 4);
  puVar1[1] = 0x3c75;
  *(int *)((long)puVar1 + 0xc) = *(int *)(uVar3 + 0x1c) + -4;
  puVar4 = puVar1 + 2;
  *(int *)puVar4 = (int)in_RDI;
  *(int *)((long)puVar1 + 0x14) = ((int)puVar4 - (int)*(undefined8 *)(in_RDI + 0x10)) + 10;
  *(ulong **)(in_RDI + 0x10) = puVar1 + 3;
  *(ulong **)(in_RDI + 0x18) = puVar1 + 3;
  lj_err_throw(in_stack_ffffffffffffffa0,(int)((ulong)puVar4 >> 0x20));
}

Assistant:

LUA_API int lua_yield(lua_State *L, int nresults)
{
  void *cf = L->cframe;
  global_State *g = G(L);
  if (cframe_canyield(cf)) {
    cf = cframe_raw(cf);
    if (!hook_active(g)) {  /* Regular yield: move results down if needed. */
      cTValue *f = L->top - nresults;
      if (f > L->base) {
	TValue *t = L->base;
	while (--nresults >= 0) copyTV(L, t++, f++);
	L->top = t;
      }
      L->cframe = NULL;
      L->status = LUA_YIELD;
      return -1;
    } else {  /* Yield from hook: add a pseudo-frame. */
      TValue *top = L->top;
      hook_leave(g);
      (top++)->u64 = cframe_multres(cf);
      setcont(top, lj_cont_hook);
      if (LJ_FR2) top++;
      setframe_pc(top, cframe_pc(cf)-1);
      top++;
      setframe_gc(top, obj2gco(L), LJ_TTHREAD);
      if (LJ_FR2) top++;
      setframe_ftsz(top, ((char *)(top+1)-(char *)L->base)+FRAME_CONT);
      L->top = L->base = top+1;
#if ((defined(__GNUC__) || defined(__clang__)) && (LJ_TARGET_X64 || defined(LUAJIT_UNWIND_EXTERNAL)) && !LJ_NO_UNWIND) || LJ_TARGET_WINDOWS
      lj_err_throw(L, LUA_YIELD);
#else
      L->cframe = NULL;
      L->status = LUA_YIELD;
      lj_vm_unwind_c(cf, LUA_YIELD);
#endif
    }
  }
  lj_err_msg(L, LJ_ERR_CYIELD);
  return 0;  /* unreachable */
}